

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

ExpEmit __thiscall FxATan2::Emit(FxATan2 *this,VMFunctionBuilder *build)

{
  uint uVar1;
  ExpEmit EVar2;
  ExpEmit EVar3;
  FxATan2 *this_00;
  
  this_00 = this;
  EVar2 = ToReg(this,build,this->yval);
  EVar3 = ToReg(this_00,build,this->xval);
  if (((ulong)EVar2 & 0x10100fc0000) == 0) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + (EVar2._2_4_ & 3),EVar2._0_4_ & 0xffff,EVar2._3_4_ & 0xff);
  }
  if (((ulong)EVar3 & 0x10100fc0000) == 0) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + (EVar3._2_4_ & 3),EVar3._0_4_ & 0xffff,EVar3._3_4_ & 0xff);
  }
  uVar1 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 1,1);
  VMFunctionBuilder::Emit(build,0xab,uVar1 & 0xffff,EVar2._0_4_ & 0xffff,EVar3._0_4_ & 0xffff);
  EVar2._0_4_ = uVar1 & 0xffff | 0x1010000;
  EVar2.Konst = false;
  EVar2.Fixed = false;
  EVar2.Final = false;
  EVar2.Target = false;
  return EVar2;
}

Assistant:

ExpEmit FxATan2::Emit(VMFunctionBuilder *build)
{
	ExpEmit yreg = ToReg(build, yval);
	ExpEmit xreg = ToReg(build, xval);
	yreg.Free(build);
	xreg.Free(build);
	ExpEmit out(build, REGT_FLOAT);
	build->Emit(OP_ATAN2, out.RegNum, yreg.RegNum, xreg.RegNum);
	return out;
}